

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

optional<unsigned_int> __thiscall
slang::ast::ValueExpressionBase::getEffectiveWidthImpl(ValueExpressionBase *this)

{
  optional<unsigned_int> *in_RDI;
  EnumValueSymbol *in_stack_000000d8;
  undefined1 in_stack_000000e0 [16];
  ParameterSymbol *in_stack_00000158;
  undefined1 in_stack_00000160 [16];
  SpecparamSymbol *in_stack_000001a8;
  undefined1 in_stack_000001b0 [16];
  uint *in_stack_ffffffffffffffa8;
  int iVar1;
  undefined4 in_stack_ffffffffffffffbc;
  ConstantValue *in_stack_ffffffffffffffc8;
  _Optional_payload_base<unsigned_int> this_00;
  _Optional_payload_base<unsigned_int> local_8;
  
  iVar1 = *(int *)in_RDI[6].super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int>;
  if (iVar1 == 0xb) {
    Symbol::as<slang::ast::EnumValueSymbol>((Symbol *)0xa1d6e8);
    EnumValueSymbol::getValue(in_stack_000000d8,(SourceRange)in_stack_000000e0);
    local_8 = (_Optional_payload_base<unsigned_int>)
              slang::ConstantValue::getEffectiveWidth(in_stack_ffffffffffffffc8);
  }
  else if (iVar1 == 0x27) {
    Symbol::as<slang::ast::ParameterSymbol>((Symbol *)0xa1d69f);
    ParameterSymbol::getValue(in_stack_00000158,(SourceRange)in_stack_00000160);
    local_8 = (_Optional_payload_base<unsigned_int>)
              slang::ConstantValue::getEffectiveWidth(in_stack_ffffffffffffffc8);
  }
  else if (iVar1 == 0x4a) {
    Symbol::as<slang::ast::SpecparamSymbol>((Symbol *)0xa1d72e);
    this_00 = in_RDI[5].super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>;
    SpecparamSymbol::getValue(in_stack_000001a8,(SourceRange)in_stack_000001b0);
    local_8 = (_Optional_payload_base<unsigned_int>)
              slang::ConstantValue::getEffectiveWidth((ConstantValue *)this_00);
  }
  else {
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xa1d774);
    Type::getBitWidth((Type *)CONCAT44(in_stack_ffffffffffffffbc,iVar1));
    std::optional<unsigned_int>::optional<unsigned_int,_true>(in_RDI,in_stack_ffffffffffffffa8);
  }
  return (optional<unsigned_int>)local_8;
}

Assistant:

std::optional<bitwidth_t> ValueExpressionBase::getEffectiveWidthImpl() const {
    switch (symbol.kind) {
        case SymbolKind::Parameter:
            return symbol.as<ParameterSymbol>().getValue(sourceRange).getEffectiveWidth();
        case SymbolKind::EnumValue:
            return symbol.as<EnumValueSymbol>().getValue(sourceRange).getEffectiveWidth();
        case SymbolKind::Specparam:
            return symbol.as<SpecparamSymbol>().getValue(sourceRange).getEffectiveWidth();
        default:
            return type->getBitWidth();
    }
}